

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

int symbol_generate(lgx_ast_t *ast,lgx_ast_node_t *node)

{
  int iVar1;
  uint local_20;
  uint local_1c;
  int ret;
  int i;
  lgx_ast_node_t *node_local;
  lgx_ast_t *ast_local;
  
  local_20 = 0;
  switch(*(undefined1 *)node) {
  case 0x13:
    break;
  case 0x14:
    break;
  case 0x15:
    break;
  case 0x16:
    iVar1 = symbol_add_variable(ast,node);
    local_20 = (uint)(iVar1 != 0);
    break;
  case 0x17:
    iVar1 = symbol_add_constant(ast,node);
    local_20 = (uint)(iVar1 != 0);
    break;
  case 0x18:
    iVar1 = symbol_add_function(ast,node);
    local_20 = (uint)(iVar1 != 0);
    break;
  case 0x19:
  }
  for (local_1c = 0; local_1c < node->children; local_1c = local_1c + 1) {
    iVar1 = symbol_generate(ast,node->child[(int)local_1c]);
    if (iVar1 != 0) {
      local_20 = 1;
    }
  }
  return local_20;
}

Assistant:

static int symbol_generate(lgx_ast_t* ast, lgx_ast_node_t* node) {
    int i, ret = 0;

    switch (node->type) {
        case PACKAGE_DECLARATION:
            break;
        case IMPORT_DECLARATION:
            break;
        case EXPORT_DECLARATION:
            break;
        case VARIABLE_DECLARATION:
            if (symbol_add_variable(ast, node)) {
                ret = 1;
            }
            break;
        case CONSTANT_DECLARATION:
            if (symbol_add_constant(ast, node)) {
                ret = 1;
            }
            break;
        case FUNCTION_DECLARATION:
            if (symbol_add_function(ast, node)) {
                ret = 1;
            }
            break;
        case TYPE_DECLARATION:
            break;
        default: break;
    }

    for (i = 0; i < node->children; ++i) {
        if (symbol_generate(ast, node->child[i])) {
            ret = 1;
        }
    }
    
    return ret;
}